

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  byte bVar1;
  uchar uVar2;
  ushort uVar3;
  int iVar4;
  stbi__uint32 sVar5;
  uint uVar6;
  bool bVar7;
  undefined8 uVar8;
  char cVar9;
  stbi__uint16 sVar10;
  int iVar11;
  uint uVar12;
  stbi__uint32 sVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  stbi_uc *psVar21;
  void *pvVar22;
  stbi__context *data;
  uchar *data_00;
  float *data_01;
  stbi_uc *psVar23;
  stbi__uint16 *data_02;
  byte *pbVar24;
  uchar *puVar25;
  byte bVar26;
  uint uVar27;
  char *pcVar28;
  stbi_uc *psVar29;
  byte *pbVar30;
  stbi_uc sVar31;
  uint uVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  stbi__uint32 sVar36;
  ulong uVar37;
  stbi__uint16 *psVar38;
  int iVar39;
  ulong uVar40;
  ulong uVar41;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  uint uVar42;
  stbi__uint16 *psVar43;
  long *in_FS_OFFSET;
  bool bVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar116;
  int iVar124;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar125 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  int iVar155;
  int iVar159;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  stbi_uc pal [256] [4];
  stbi__uint16 *local_89a8;
  uint local_8998;
  stbi__uint16 *local_8968;
  uint local_894c;
  stbi__bmp_data local_88dc;
  ulong local_88b8;
  ulong local_88b0;
  stbi__gif local_88a8;
  
  psVar29 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri_00 = ri;
  iVar11 = stbi__check_png_header(s);
  psVar23 = s->img_buffer_original;
  s->img_buffer = psVar23;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar11 != 0) {
    if ((uint)req_comp < 5) {
      local_88a8._0_8_ = s;
      iVar11 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      uVar8 = local_88a8._0_8_;
      if (iVar11 == 0) {
        data = (stbi__context *)0x0;
      }
      else {
        iVar11 = 8;
        if ((8 < local_88a8.flags) && (iVar11 = 0x10, local_88a8.flags != 0x10)) {
          lVar33 = *in_FS_OFFSET;
          pcVar28 = "bad bits_per_channel";
          goto LAB_001b1f1f;
        }
        ri->bits_per_channel = iVar11;
        data = (stbi__context *)local_88a8.history;
        if ((req_comp != 0) && (iVar11 = *(int *)(local_88a8._0_8_ + 0xc), iVar11 != req_comp)) {
          if (local_88a8.flags < 9) {
            data = (stbi__context *)
                   stbi__convert_format
                             (local_88a8.history,iVar11,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                              *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          else {
            data = (stbi__context *)
                   stbi__convert_format16
                             ((stbi__uint16 *)local_88a8.history,iVar11,req_comp,
                              *(stbi__uint32 *)local_88a8._0_8_,
                              *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          *(int *)(uVar8 + 0xc) = req_comp;
          if (data == (stbi__context *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(stbi__uint32 *)uVar8;
        *y = *(stbi__uint32 *)(uVar8 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar8 + 8);
        }
        local_88a8.history = (stbi_uc *)0x0;
      }
      free(local_88a8.history);
      free(local_88a8.background);
      goto LAB_001b23d5;
    }
    lVar33 = *in_FS_OFFSET;
    pcVar28 = "bad req_comp";
    goto LAB_001b1f1f;
  }
  if (psVar23 < s->img_buffer_original_end) {
LAB_001b1f59:
    psVar21 = psVar23 + 1;
    s->img_buffer = psVar21;
    if (*psVar23 != 'B') goto LAB_001b210f;
    if (s->img_buffer_end <= psVar21) {
      if (s->read_from_callbacks == 0) goto LAB_001b210f;
      stbi__refill_buffer(s);
      psVar21 = s->img_buffer;
    }
    s->img_buffer = psVar21 + 1;
    if (*psVar21 != 'M') goto LAB_001b210f;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar12 = stbi__get16le(s);
    iVar11 = stbi__get16le(s);
    uVar12 = iVar11 << 0x10 | uVar12;
    if (((0x38 < uVar12) || ((0x100010000001000U >> ((ulong)uVar12 & 0x3f) & 1) == 0)) &&
       (uVar12 != 0x6c)) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (uVar12 == 0x7c) goto LAB_001b2022;
      goto LAB_001b2123;
    }
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_001b2022:
    local_88dc.all_a = 0xff;
    pvVar22 = stbi__bmp_parse_header(s,&local_88dc);
    if (pvVar22 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar12 = s->img_y;
    uVar17 = -uVar12;
    if (0 < (int)uVar12) {
      uVar17 = uVar12;
    }
    s->img_y = uVar17;
    if ((uVar17 < 0x1000001) && (uVar32 = s->img_x, uVar32 < 0x1000001)) {
      if (local_88dc.hsz == 0xc) {
        if (0x17 < local_88dc.bpp) goto LAB_001b2624;
        uVar27 = ((local_88dc.offset - local_88dc.extra_read) + -0x18) / 3;
LAB_001b2600:
        if (uVar27 == 0) goto LAB_001b2624;
        bVar7 = false;
LAB_001b2692:
        bVar44 = local_88dc.ma == 0xff000000;
        iVar11 = 4 - (uint)(local_88dc.ma == 0);
        iVar39 = local_88dc.bpp;
      }
      else {
        if (local_88dc.bpp < 0x10) {
          uVar27 = local_88dc.offset - (local_88dc.extra_read + local_88dc.hsz) >> 2;
          goto LAB_001b2600;
        }
LAB_001b2624:
        if (s->img_buffer + ((long)s->callback_already_read - (long)s->img_buffer_original) !=
            (stbi_uc *)(long)local_88dc.offset) {
          lVar33 = *in_FS_OFFSET;
          pcVar28 = "bad offset";
          goto LAB_001b1f1f;
        }
        uVar27 = 0;
        bVar44 = true;
        bVar7 = true;
        if (local_88dc.bpp != 0x18 || local_88dc.ma != 0xff000000) goto LAB_001b2692;
        iVar11 = 3;
        iVar39 = 0x18;
        bVar7 = true;
      }
      local_8998 = local_88dc.all_a;
      s->img_n = iVar11;
      if (2 < req_comp) {
        iVar11 = req_comp;
      }
      iVar15 = stbi__mad3sizes_valid(iVar11,uVar32,uVar17,0);
      if (iVar15 == 0) goto LAB_001b2ab0;
      data_00 = (uchar *)stbi__malloc_mad3(iVar11,uVar32,uVar17,0);
      if (data_00 != (uchar *)0x0) {
        if (iVar39 < 0x10) {
          if (!bVar7 && (int)uVar27 < 0x101) {
            if (0 < (int)uVar27) {
              psVar29 = s->img_buffer;
              uVar40 = 0;
              psVar23 = psVar29;
              do {
                psVar21 = s->img_buffer_end;
                if (psVar29 < psVar21) {
LAB_001b28d9:
                  psVar23 = psVar29 + 1;
                  s->img_buffer = psVar23;
                  sVar31 = *psVar29;
                  psVar29 = psVar23;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar29 = s->img_buffer;
                    psVar21 = s->img_buffer_end;
                    goto LAB_001b28d9;
                  }
                  sVar31 = '\0';
                }
                local_88a8.pal[uVar40 - 0xd][2] = sVar31;
                if (psVar29 < psVar21) {
LAB_001b291c:
                  psVar23 = psVar29 + 1;
                  s->img_buffer = psVar23;
                  sVar31 = *psVar29;
                  psVar29 = psVar23;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar29 = s->img_buffer;
                    psVar21 = s->img_buffer_end;
                    goto LAB_001b291c;
                  }
                  sVar31 = '\0';
                }
                local_88a8.pal[uVar40 - 0xd][1] = sVar31;
                if (psVar29 < psVar21) {
LAB_001b2957:
                  psVar23 = psVar29 + 1;
                  s->img_buffer = psVar23;
                  sVar31 = *psVar29;
                  psVar29 = psVar23;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar29 = s->img_buffer;
                    goto LAB_001b2957;
                  }
                  sVar31 = '\0';
                }
                local_88a8.pal[uVar40 - 0xd][0] = sVar31;
                if (local_88dc.hsz != 0xc) {
                  if (s->img_buffer_end <= psVar23) {
                    psVar29 = psVar23;
                    if (s->read_from_callbacks == 0) goto LAB_001b29a9;
                    stbi__refill_buffer(s);
                    psVar23 = s->img_buffer;
                  }
                  psVar29 = psVar23 + 1;
                  s->img_buffer = psVar29;
                  psVar23 = psVar29;
                }
LAB_001b29a9:
                local_88a8.pal[uVar40 - 0xd][3] = 0xff;
                uVar40 = uVar40 + 1;
              } while (uVar27 != uVar40);
            }
            stbi__skip(s,(uVar27 * (local_88dc.hsz == 0xc | 0xfffffffc) + local_88dc.offset) -
                         (local_88dc.hsz + local_88dc.extra_read));
            if (iVar39 == 1) {
              sVar13 = s->img_y;
              if (0 < (int)sVar13) {
                sVar5 = s->img_x;
                iVar15 = 0;
                iVar39 = 0;
                do {
                  pbVar24 = s->img_buffer;
                  if (pbVar24 < s->img_buffer_end) {
LAB_001b3285:
                    s->img_buffer = pbVar24 + 1;
                    uVar17 = (uint)*pbVar24;
                    pbVar24 = pbVar24 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar24 = s->img_buffer;
                      goto LAB_001b3285;
                    }
                    uVar17 = 0;
                  }
                  sVar13 = s->img_x;
                  if (0 < (int)sVar13) {
                    sVar36 = 0;
                    uVar32 = 7;
                    do {
                      uVar40 = (ulong)((uVar17 >> (uVar32 & 0x1f) & 1) != 0);
                      data_00[iVar15] = local_88a8.pal[uVar40 - 0xd][0];
                      data_00[(long)iVar15 + 1] = local_88a8.pal[uVar40 - 0xd][1];
                      data_00[(long)iVar15 + 2] = local_88a8.pal[uVar40 - 0xd][2];
                      iVar35 = iVar15 + 3;
                      if (iVar11 == 4) {
                        data_00[(long)iVar15 + 3] = 0xff;
                        iVar35 = iVar15 + 4;
                      }
                      iVar15 = iVar35;
                      sVar36 = sVar36 + 1;
                      if (sVar36 == sVar13) break;
                      if ((int)uVar32 < 1) {
                        if (s->img_buffer_end <= pbVar24) {
                          if (s->read_from_callbacks == 0) {
                            uVar17 = 0;
                            uVar32 = 7;
                            goto LAB_001b334d;
                          }
                          stbi__refill_buffer(s);
                          pbVar24 = s->img_buffer;
                          sVar13 = s->img_x;
                        }
                        s->img_buffer = pbVar24 + 1;
                        uVar17 = (uint)*pbVar24;
                        uVar32 = 7;
                        pbVar24 = pbVar24 + 1;
                      }
                      else {
                        uVar32 = uVar32 - 1;
                      }
LAB_001b334d:
                    } while ((int)sVar36 < (int)sVar13);
                  }
                  stbi__skip(s,-(sVar5 + 7 >> 3) & 3);
                  iVar39 = iVar39 + 1;
                  sVar13 = s->img_y;
                } while (iVar39 < (int)sVar13);
              }
            }
            else {
              if (iVar39 == 8) {
                uVar17 = s->img_x;
              }
              else {
                if (iVar39 != 4) {
                  free(data_00);
                  lVar33 = *in_FS_OFFSET;
                  pcVar28 = "bad bpp";
                  goto LAB_001b1f1f;
                }
                uVar17 = s->img_x + 1 >> 1;
              }
              sVar13 = s->img_y;
              if (0 < (int)sVar13) {
                local_8968._0_4_ = -uVar17 & 3;
                uVar40 = 0;
                iVar15 = 0;
                do {
                  if (0 < (int)s->img_x) {
                    pbVar24 = s->img_buffer;
                    iVar35 = 0;
                    do {
                      if (pbVar24 < s->img_buffer_end) {
LAB_001b30e1:
                        s->img_buffer = pbVar24 + 1;
                        uVar17 = (uint)*pbVar24;
                        pbVar24 = pbVar24 + 1;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          pbVar24 = s->img_buffer;
                          goto LAB_001b30e1;
                        }
                        uVar17 = 0;
                      }
                      uVar27 = uVar17 & 0xf;
                      uVar32 = uVar17 >> 4;
                      if (iVar39 != 4) {
                        uVar32 = uVar17;
                      }
                      uVar41 = (ulong)uVar32;
                      if (iVar39 != 4) {
                        uVar27 = 0;
                      }
                      lVar33 = (long)(int)uVar40;
                      uVar37 = lVar33 + 3;
                      data_00[lVar33] = local_88a8.pal[uVar41 - 0xd][0];
                      data_00[lVar33 + 1] = local_88a8.pal[uVar41 - 0xd][1];
                      data_00[lVar33 + 2] = local_88a8.pal[uVar41 - 0xd][2];
                      if (iVar11 == 4) {
                        data_00[lVar33 + 3] = 0xff;
                        uVar37 = (ulong)((int)uVar40 + 4);
                      }
                      if (iVar35 + 1U == s->img_x) {
                        uVar40 = uVar37 & 0xffffffff;
                        break;
                      }
                      if (iVar39 == 8) {
                        if (s->img_buffer_end <= pbVar24) {
                          if (s->read_from_callbacks == 0) {
                            uVar27 = 0;
                            goto LAB_001b31a1;
                          }
                          stbi__refill_buffer(s);
                          pbVar24 = s->img_buffer;
                        }
                        s->img_buffer = pbVar24 + 1;
                        uVar27 = (uint)*pbVar24;
                        pbVar24 = pbVar24 + 1;
                      }
LAB_001b31a1:
                      lVar33 = (long)(int)uVar37;
                      uVar40 = lVar33 + 3;
                      uVar41 = (ulong)uVar27;
                      data_00[lVar33] = local_88a8.pal[uVar41 - 0xd][0];
                      data_00[lVar33 + 1] = local_88a8.pal[uVar41 - 0xd][1];
                      data_00[lVar33 + 2] = local_88a8.pal[uVar41 - 0xd][2];
                      if (iVar11 == 4) {
                        data_00[lVar33 + 3] = 0xff;
                        uVar40 = (ulong)((int)uVar37 + 4);
                      }
                      iVar35 = iVar35 + 2;
                    } while (iVar35 < (int)s->img_x);
                  }
                  stbi__skip(s,(uint)local_8968);
                  iVar15 = iVar15 + 1;
                  sVar13 = s->img_y;
                } while (iVar15 < (int)sVar13);
              }
            }
            goto LAB_001b33bf;
          }
          free(data_00);
          lVar33 = *in_FS_OFFSET;
          pcVar28 = "invalid";
          goto LAB_001b1f1f;
        }
        stbi__skip(s,local_88dc.offset - (local_88dc.hsz + local_88dc.extra_read));
        if (iVar39 != 0x10) {
          if (iVar39 == 0x20) {
            local_894c = 0;
            if (!(bool)((local_88dc.mr == 0xff0000 &&
                        (local_88dc.mg == 0xff00 && local_88dc.mb == 0xff)) & bVar44))
            goto LAB_001b2b3f;
            bVar7 = true;
            bVar44 = false;
            iVar15 = 0;
            iVar35 = 0;
            iVar18 = 0;
            iVar155 = 0;
            uVar17 = 0;
            uVar32 = 0;
            uVar27 = 0;
            uVar16 = 0;
          }
          else {
            local_894c = 0;
            if (iVar39 != 0x18) goto LAB_001b2b3f;
            local_894c = s->img_x & 3;
            bVar7 = false;
            bVar44 = false;
            iVar15 = 0;
            iVar35 = 0;
            iVar18 = 0;
            iVar155 = 0;
            uVar17 = 0;
            uVar32 = 0;
            uVar27 = 0;
            uVar16 = 0;
          }
LAB_001b2c78:
          sVar13 = s->img_y;
          if (0 < (int)sVar13) {
            iVar124 = 0;
            local_88b0 = (ulong)(uVar27 << 2);
            local_88b8 = (ulong)(uVar16 << 2);
            iVar159 = 0;
            do {
              if (bVar44) {
                if (0 < (int)s->img_x) {
                  iVar34 = 0;
                  do {
                    uVar19 = stbi__get16le(s);
                    if (iVar39 != 0x10) {
                      iVar20 = stbi__get16le(s);
                      uVar19 = uVar19 | iVar20 << 0x10;
                    }
                    uVar42 = (uVar19 & local_88dc.mr) >> ((byte)iVar15 & 0x1f);
                    if (iVar15 < 0) {
                      uVar42 = (uVar19 & local_88dc.mr) << (-(byte)iVar15 & 0x1f);
                    }
                    uVar14 = (uVar19 & local_88dc.mg) >> ((byte)iVar35 & 0x1f);
                    if (iVar35 < 0) {
                      uVar14 = (uVar19 & local_88dc.mg) << (-(byte)iVar35 & 0x1f);
                    }
                    iVar20 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                     (uVar32 << 2));
                    bVar26 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[uVar32 << 2];
                    uVar6 = (uVar19 & local_88dc.mb) >> ((byte)iVar18 & 0x1f);
                    if (iVar18 < 0) {
                      uVar6 = (uVar19 & local_88dc.mb) << (-(byte)iVar18 & 0x1f);
                    }
                    iVar4 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table + local_88b0
                                    );
                    bVar1 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88b0];
                    data_00[iVar124] =
                         (uchar)((int)((uVar42 >> (8U - (char)uVar17 & 0x1f)) *
                                      *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                              (uVar17 << 2))) >>
                                (stbi__shiftsigned(unsigned_int,int,int)::shift_table[uVar17 << 2] &
                                0x1f));
                    data_00[(long)iVar124 + 1] =
                         (uchar)((int)((uVar14 >> (8U - (char)uVar32 & 0x1f)) * iVar20) >>
                                (bVar26 & 0x1f));
                    data_00[(long)iVar124 + 2] =
                         (uchar)((int)((uVar6 >> (8U - (char)uVar27 & 0x1f)) * iVar4) >>
                                (bVar1 & 0x1f));
                    if (local_88dc.ma == 0) {
                      uVar19 = 0xff;
                    }
                    else {
                      uVar42 = (uVar19 & local_88dc.ma) >> ((byte)iVar155 & 0x1f);
                      if (iVar155 < 0) {
                        uVar42 = (uVar19 & local_88dc.ma) << (-(byte)iVar155 & 0x1f);
                      }
                      uVar19 = (int)((uVar42 >> (8U - (char)uVar16 & 0x1f)) *
                                    *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                            local_88b8)) >>
                               (stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88b8] &
                               0x1f);
                    }
                    iVar20 = iVar124 + 3;
                    if (iVar11 == 4) {
                      data_00[(long)iVar124 + 3] = (uchar)uVar19;
                      iVar20 = iVar124 + 4;
                    }
                    iVar124 = iVar20;
                    local_8998 = local_8998 | uVar19;
                    iVar34 = iVar34 + 1;
                  } while (iVar34 < (int)s->img_x);
                }
              }
              else if (0 < (int)s->img_x) {
                pbVar24 = s->img_buffer;
                iVar34 = 0;
                do {
                  pbVar30 = s->img_buffer_end;
                  if (pbVar24 < pbVar30) {
LAB_001b2f15:
                    s->img_buffer = pbVar24 + 1;
                    bVar26 = *pbVar24;
                    pbVar24 = pbVar24 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar24 = s->img_buffer;
                      pbVar30 = s->img_buffer_end;
                      goto LAB_001b2f15;
                    }
                    bVar26 = 0;
                  }
                  data_00[(long)iVar124 + 2] = bVar26;
                  if (pbVar24 < pbVar30) {
LAB_001b2f5c:
                    s->img_buffer = pbVar24 + 1;
                    bVar26 = *pbVar24;
                    pbVar24 = pbVar24 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar24 = s->img_buffer;
                      pbVar30 = s->img_buffer_end;
                      goto LAB_001b2f5c;
                    }
                    bVar26 = 0;
                  }
                  data_00[(long)iVar124 + 1] = bVar26;
                  if (pbVar24 < pbVar30) {
LAB_001b2f98:
                    s->img_buffer = pbVar24 + 1;
                    bVar26 = *pbVar24;
                    pbVar24 = pbVar24 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar24 = s->img_buffer;
                      goto LAB_001b2f98;
                    }
                    bVar26 = 0;
                  }
                  data_00[iVar124] = bVar26;
                  bVar26 = 0xff;
                  if (bVar7) {
                    if (s->img_buffer_end <= pbVar24) {
                      if (s->read_from_callbacks == 0) {
                        bVar26 = 0;
                        goto LAB_001b2ff2;
                      }
                      stbi__refill_buffer(s);
                      pbVar24 = s->img_buffer;
                    }
                    s->img_buffer = pbVar24 + 1;
                    bVar26 = *pbVar24;
                    pbVar24 = pbVar24 + 1;
                  }
LAB_001b2ff2:
                  iVar20 = iVar124 + 3;
                  if (iVar11 == 4) {
                    data_00[(long)iVar124 + 3] = bVar26;
                    iVar20 = iVar124 + 4;
                  }
                  iVar124 = iVar20;
                  local_8998 = local_8998 | bVar26;
                  iVar34 = iVar34 + 1;
                } while (iVar34 < (int)s->img_x);
              }
              stbi__skip(s,local_894c);
              iVar159 = iVar159 + 1;
              sVar13 = s->img_y;
            } while (iVar159 < (int)sVar13);
          }
LAB_001b33bf:
          auVar81 = _DAT_0024f2f0;
          auVar129 = _DAT_0024f2e0;
          auVar77 = _DAT_0024f2d0;
          auVar56 = _DAT_0024f2c0;
          auVar131 = _DAT_0024dd10;
          auVar47 = _DAT_0024dd00;
          auVar125 = _DAT_00246480;
          if (((iVar11 == 4) && (local_8998 == 0)) &&
             (uVar17 = s->img_x * sVar13 * 4 - 1, -1 < (int)uVar17)) {
            uVar32 = uVar17 >> 2;
            auVar82._4_4_ = 0;
            auVar82._0_4_ = uVar32;
            auVar82._8_4_ = uVar32;
            auVar82._12_4_ = 0;
            puVar25 = data_00 + uVar17;
            uVar40 = 0;
            auVar54._8_4_ = 0xffffffff;
            auVar54._0_8_ = 0xffffffffffffffff;
            auVar54._12_4_ = 0xffffffff;
            do {
              auVar132._8_4_ = (int)uVar40;
              auVar132._0_8_ = uVar40;
              auVar132._12_4_ = (int)(uVar40 >> 0x20);
              auVar134 = auVar82 | auVar125;
              auVar136 = (auVar132 | auVar131) ^ auVar125;
              iVar39 = auVar134._0_4_;
              iVar155 = -(uint)(iVar39 < auVar136._0_4_);
              iVar15 = auVar134._4_4_;
              auVar138._4_4_ = -(uint)(iVar15 < auVar136._4_4_);
              iVar35 = auVar134._8_4_;
              iVar159 = -(uint)(iVar35 < auVar136._8_4_);
              iVar18 = auVar134._12_4_;
              auVar138._12_4_ = -(uint)(iVar18 < auVar136._12_4_);
              auVar148._4_4_ = iVar155;
              auVar148._0_4_ = iVar155;
              auVar148._8_4_ = iVar159;
              auVar148._12_4_ = iVar159;
              auVar134 = pshuflw(in_XMM1,auVar148,0xe8);
              auVar137._4_4_ = -(uint)(auVar136._4_4_ == iVar15);
              auVar137._12_4_ = -(uint)(auVar136._12_4_ == iVar18);
              auVar137._0_4_ = auVar137._4_4_;
              auVar137._8_4_ = auVar137._12_4_;
              auVar59 = pshuflw(in_XMM2,auVar137,0xe8);
              auVar138._0_4_ = auVar138._4_4_;
              auVar138._8_4_ = auVar138._12_4_;
              auVar136 = pshuflw(auVar134,auVar138,0xe8);
              auVar134 = (auVar136 | auVar59 & auVar134) ^ auVar54;
              auVar134 = packssdw(auVar134,auVar134);
              if ((auVar134 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *puVar25 = 0xff;
              }
              auVar138 = auVar137 & auVar148 | auVar138;
              auVar134 = packssdw(auVar138,auVar138);
              auVar134 = packssdw(auVar134 ^ auVar54,auVar134 ^ auVar54);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134._0_4_ >> 8 & 1) != 0) {
                puVar25[-4] = 0xff;
              }
              auVar134 = (auVar132 | auVar47) ^ auVar125;
              auVar136._0_4_ = -(uint)(iVar39 < auVar134._0_4_);
              auVar136._4_4_ = -(uint)(iVar15 < auVar134._4_4_);
              auVar136._8_4_ = -(uint)(iVar35 < auVar134._8_4_);
              auVar136._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
              auVar59._4_4_ = auVar136._0_4_;
              auVar59._0_4_ = auVar136._0_4_;
              auVar59._8_4_ = auVar136._8_4_;
              auVar59._12_4_ = auVar136._8_4_;
              iVar155 = -(uint)(auVar134._4_4_ == iVar15);
              iVar159 = -(uint)(auVar134._12_4_ == iVar18);
              auVar149._4_4_ = iVar155;
              auVar149._0_4_ = iVar155;
              auVar149._8_4_ = iVar159;
              auVar149._12_4_ = iVar159;
              auVar156._4_4_ = auVar136._4_4_;
              auVar156._0_4_ = auVar136._4_4_;
              auVar156._8_4_ = auVar136._12_4_;
              auVar156._12_4_ = auVar136._12_4_;
              auVar134 = auVar149 & auVar59 | auVar156;
              auVar134 = packssdw(auVar134,auVar134);
              auVar134 = packssdw(auVar134 ^ auVar54,auVar134 ^ auVar54);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134._0_4_ >> 0x10 & 1) != 0) {
                puVar25[-8] = 0xff;
              }
              auVar134 = pshufhw(auVar134,auVar59,0x84);
              auVar59 = pshufhw(auVar136,auVar149,0x84);
              auVar136 = pshufhw(auVar134,auVar156,0x84);
              auVar134 = (auVar136 | auVar59 & auVar134) ^ auVar54;
              auVar134 = packssdw(auVar134,auVar134);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134._0_4_ >> 0x18 & 1) != 0) {
                puVar25[-0xc] = 0xff;
              }
              auVar134 = (auVar132 | auVar81) ^ auVar125;
              auVar60._0_4_ = -(uint)(iVar39 < auVar134._0_4_);
              auVar60._4_4_ = -(uint)(iVar15 < auVar134._4_4_);
              auVar60._8_4_ = -(uint)(iVar35 < auVar134._8_4_);
              auVar60._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
              auVar150._4_4_ = auVar60._0_4_;
              auVar150._0_4_ = auVar60._0_4_;
              auVar150._8_4_ = auVar60._8_4_;
              auVar150._12_4_ = auVar60._8_4_;
              auVar59 = pshuflw(auVar156,auVar150,0xe8);
              auVar51._0_4_ = -(uint)(auVar134._0_4_ == iVar39);
              auVar51._4_4_ = -(uint)(auVar134._4_4_ == iVar15);
              auVar51._8_4_ = -(uint)(auVar134._8_4_ == iVar35);
              auVar51._12_4_ = -(uint)(auVar134._12_4_ == iVar18);
              auVar139._4_4_ = auVar51._4_4_;
              auVar139._0_4_ = auVar51._4_4_;
              auVar139._8_4_ = auVar51._12_4_;
              auVar139._12_4_ = auVar51._12_4_;
              auVar134 = pshuflw(auVar51,auVar139,0xe8);
              auVar140._4_4_ = auVar60._4_4_;
              auVar140._0_4_ = auVar60._4_4_;
              auVar140._8_4_ = auVar60._12_4_;
              auVar140._12_4_ = auVar60._12_4_;
              auVar136 = pshuflw(auVar60,auVar140,0xe8);
              auVar134 = packssdw(auVar134 & auVar59,(auVar136 | auVar134 & auVar59) ^ auVar54);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar25[-0x10] = 0xff;
              }
              auVar140 = auVar139 & auVar150 | auVar140;
              auVar136 = packssdw(auVar140,auVar140);
              auVar134 = packssdw(auVar134,auVar136 ^ auVar54);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134._4_2_ >> 8 & 1) != 0) {
                puVar25[-0x14] = 0xff;
              }
              auVar134 = (auVar132 | auVar129) ^ auVar125;
              auVar61._0_4_ = -(uint)(iVar39 < auVar134._0_4_);
              auVar61._4_4_ = -(uint)(iVar15 < auVar134._4_4_);
              auVar61._8_4_ = -(uint)(iVar35 < auVar134._8_4_);
              auVar61._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
              auVar141._4_4_ = auVar61._0_4_;
              auVar141._0_4_ = auVar61._0_4_;
              auVar141._8_4_ = auVar61._8_4_;
              auVar141._12_4_ = auVar61._8_4_;
              iVar155 = -(uint)(auVar134._4_4_ == iVar15);
              iVar159 = -(uint)(auVar134._12_4_ == iVar18);
              auVar151._4_4_ = iVar155;
              auVar151._0_4_ = iVar155;
              auVar151._8_4_ = iVar159;
              auVar151._12_4_ = iVar159;
              auVar157._4_4_ = auVar61._4_4_;
              auVar157._0_4_ = auVar61._4_4_;
              auVar157._8_4_ = auVar61._12_4_;
              auVar157._12_4_ = auVar61._12_4_;
              auVar134 = auVar151 & auVar141 | auVar157;
              auVar134 = packssdw(auVar134,auVar134);
              auVar134 = packssdw(auVar134 ^ auVar54,auVar134 ^ auVar54);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar25[-0x18] = 0xff;
              }
              auVar134 = pshufhw(auVar134,auVar141,0x84);
              auVar59 = pshufhw(auVar61,auVar151,0x84);
              auVar136 = pshufhw(auVar134,auVar157,0x84);
              auVar134 = (auVar136 | auVar59 & auVar134) ^ auVar54;
              auVar134 = packssdw(auVar134,auVar134);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134._6_2_ >> 8 & 1) != 0) {
                puVar25[-0x1c] = 0xff;
              }
              auVar134 = (auVar132 | auVar77) ^ auVar125;
              auVar62._0_4_ = -(uint)(iVar39 < auVar134._0_4_);
              auVar62._4_4_ = -(uint)(iVar15 < auVar134._4_4_);
              auVar62._8_4_ = -(uint)(iVar35 < auVar134._8_4_);
              auVar62._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
              auVar152._4_4_ = auVar62._0_4_;
              auVar152._0_4_ = auVar62._0_4_;
              auVar152._8_4_ = auVar62._8_4_;
              auVar152._12_4_ = auVar62._8_4_;
              auVar59 = pshuflw(auVar157,auVar152,0xe8);
              auVar52._0_4_ = -(uint)(auVar134._0_4_ == iVar39);
              auVar52._4_4_ = -(uint)(auVar134._4_4_ == iVar15);
              auVar52._8_4_ = -(uint)(auVar134._8_4_ == iVar35);
              auVar52._12_4_ = -(uint)(auVar134._12_4_ == iVar18);
              auVar142._4_4_ = auVar52._4_4_;
              auVar142._0_4_ = auVar52._4_4_;
              auVar142._8_4_ = auVar52._12_4_;
              auVar142._12_4_ = auVar52._12_4_;
              auVar134 = pshuflw(auVar52,auVar142,0xe8);
              auVar143._4_4_ = auVar62._4_4_;
              auVar143._0_4_ = auVar62._4_4_;
              auVar143._8_4_ = auVar62._12_4_;
              auVar143._12_4_ = auVar62._12_4_;
              auVar136 = pshuflw(auVar62,auVar143,0xe8);
              auVar136 = (auVar136 | auVar134 & auVar59) ^ auVar54;
              auVar136 = packssdw(auVar136,auVar136);
              auVar134 = packsswb(auVar134 & auVar59,auVar136);
              if ((auVar134 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar25[-0x20] = 0xff;
              }
              auVar143 = auVar142 & auVar152 | auVar143;
              auVar136 = packssdw(auVar143,auVar143);
              auVar136 = packssdw(auVar136 ^ auVar54,auVar136 ^ auVar54);
              auVar134 = packsswb(auVar134,auVar136);
              if ((auVar134._8_2_ >> 8 & 1) != 0) {
                puVar25[-0x24] = 0xff;
              }
              auVar134 = (auVar132 | auVar56) ^ auVar125;
              auVar63._0_4_ = -(uint)(iVar39 < auVar134._0_4_);
              auVar63._4_4_ = -(uint)(iVar15 < auVar134._4_4_);
              auVar63._8_4_ = -(uint)(iVar35 < auVar134._8_4_);
              auVar63._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
              auVar144._4_4_ = auVar63._0_4_;
              auVar144._0_4_ = auVar63._0_4_;
              auVar144._8_4_ = auVar63._8_4_;
              auVar144._12_4_ = auVar63._8_4_;
              iVar155 = -(uint)(auVar134._4_4_ == iVar15);
              iVar159 = -(uint)(auVar134._12_4_ == iVar18);
              auVar153._4_4_ = iVar155;
              auVar153._0_4_ = iVar155;
              auVar153._8_4_ = iVar159;
              auVar153._12_4_ = iVar159;
              auVar158._4_4_ = auVar63._4_4_;
              auVar158._0_4_ = auVar63._4_4_;
              auVar158._8_4_ = auVar63._12_4_;
              auVar158._12_4_ = auVar63._12_4_;
              auVar134 = auVar153 & auVar144 | auVar158;
              auVar134 = packssdw(auVar134,auVar134);
              auVar134 = packssdw(auVar134 ^ auVar54,auVar134 ^ auVar54);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar25[-0x28] = 0xff;
              }
              auVar134 = pshufhw(auVar134,auVar144,0x84);
              auVar59 = pshufhw(auVar63,auVar153,0x84);
              auVar136 = pshufhw(auVar134,auVar158,0x84);
              auVar134 = (auVar136 | auVar59 & auVar134) ^ auVar54;
              auVar134 = packssdw(auVar134,auVar134);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134._10_2_ >> 8 & 1) != 0) {
                puVar25[-0x2c] = 0xff;
              }
              auVar134 = (auVar132 | _DAT_0024f2b0) ^ auVar125;
              auVar64._0_4_ = -(uint)(iVar39 < auVar134._0_4_);
              auVar64._4_4_ = -(uint)(iVar15 < auVar134._4_4_);
              auVar64._8_4_ = -(uint)(iVar35 < auVar134._8_4_);
              auVar64._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
              auVar154._4_4_ = auVar64._0_4_;
              auVar154._0_4_ = auVar64._0_4_;
              auVar154._8_4_ = auVar64._8_4_;
              auVar154._12_4_ = auVar64._8_4_;
              auVar59 = pshuflw(auVar158,auVar154,0xe8);
              auVar53._0_4_ = -(uint)(auVar134._0_4_ == iVar39);
              auVar53._4_4_ = -(uint)(auVar134._4_4_ == iVar15);
              auVar53._8_4_ = -(uint)(auVar134._8_4_ == iVar35);
              auVar53._12_4_ = -(uint)(auVar134._12_4_ == iVar18);
              auVar145._4_4_ = auVar53._4_4_;
              auVar145._0_4_ = auVar53._4_4_;
              auVar145._8_4_ = auVar53._12_4_;
              auVar145._12_4_ = auVar53._12_4_;
              auVar134 = pshuflw(auVar53,auVar145,0xe8);
              auVar146._4_4_ = auVar64._4_4_;
              auVar146._0_4_ = auVar64._4_4_;
              auVar146._8_4_ = auVar64._12_4_;
              auVar146._12_4_ = auVar64._12_4_;
              auVar136 = pshuflw(auVar64,auVar146,0xe8);
              auVar134 = packssdw(auVar134 & auVar59,(auVar136 | auVar134 & auVar59) ^ auVar54);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar25[-0x30] = 0xff;
              }
              auVar146 = auVar145 & auVar154 | auVar146;
              auVar136 = packssdw(auVar146,auVar146);
              auVar134 = packssdw(auVar134,auVar136 ^ auVar54);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134._12_2_ >> 8 & 1) != 0) {
                puVar25[-0x34] = 0xff;
              }
              auVar136 = (auVar132 | _DAT_0024f2a0) ^ auVar125;
              auVar134._0_4_ = -(uint)(iVar39 < auVar136._0_4_);
              auVar134._4_4_ = -(uint)(iVar15 < auVar136._4_4_);
              auVar134._8_4_ = -(uint)(iVar35 < auVar136._8_4_);
              auVar134._12_4_ = -(uint)(iVar18 < auVar136._12_4_);
              auVar147._4_4_ = auVar134._0_4_;
              auVar147._0_4_ = auVar134._0_4_;
              auVar147._8_4_ = auVar134._8_4_;
              auVar147._12_4_ = auVar134._8_4_;
              auVar133._4_4_ = -(uint)(auVar136._4_4_ == iVar15);
              auVar133._12_4_ = -(uint)(auVar136._12_4_ == iVar18);
              auVar133._0_4_ = auVar133._4_4_;
              auVar133._8_4_ = auVar133._12_4_;
              auVar135._4_4_ = auVar134._4_4_;
              auVar135._0_4_ = auVar134._4_4_;
              auVar135._8_4_ = auVar134._12_4_;
              auVar135._12_4_ = auVar134._12_4_;
              auVar136 = auVar133 & auVar147 | auVar135;
              auVar134 = packssdw(auVar134,auVar136);
              auVar134 = packssdw(auVar134 ^ auVar54,auVar134 ^ auVar54);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar25[-0x38] = 0xff;
              }
              auVar134 = pshufhw(auVar134,auVar147,0x84);
              in_XMM2 = pshufhw(auVar136,auVar133,0x84);
              in_XMM2 = in_XMM2 & auVar134;
              auVar134 = pshufhw(auVar134,auVar135,0x84);
              auVar134 = (auVar134 | in_XMM2) ^ auVar54;
              auVar134 = packssdw(auVar134,auVar134);
              in_XMM1 = packsswb(auVar134,auVar134);
              if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                puVar25[-0x3c] = 0xff;
              }
              uVar40 = uVar40 + 0x10;
              puVar25 = puVar25 + -0x40;
            } while ((uVar32 + 0x10 & 0x3ffffff0) != uVar40);
          }
          if ((int)uVar12 < 1) {
            uVar12 = s->img_x;
          }
          else {
            uVar12 = s->img_x;
            if (0 < (int)sVar13 >> 1) {
              uVar17 = uVar12 * iVar11;
              uVar32 = (sVar13 - 1) * uVar17;
              uVar40 = 0;
              uVar41 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar37 = 0;
                  do {
                    uVar2 = data_00[uVar37 + uVar40];
                    data_00[uVar37 + uVar40] = data_00[uVar37 + uVar32];
                    data_00[uVar37 + uVar32] = uVar2;
                    uVar37 = uVar37 + 1;
                  } while (uVar17 != uVar37);
                }
                uVar41 = uVar41 + 1;
                uVar32 = uVar32 - uVar17;
                uVar40 = (ulong)((int)uVar40 + uVar17);
              } while (uVar41 != (uint)((int)sVar13 >> 1));
            }
          }
          if ((req_comp != 0) && (iVar11 != req_comp)) {
            data_00 = stbi__convert_format(data_00,iVar11,req_comp,uVar12,sVar13);
            if (data_00 == (uchar *)0x0) {
              return (void *)0x0;
            }
            uVar12 = s->img_x;
          }
          *x = uVar12;
          *y = s->img_y;
          if (comp != (int *)0x0) {
            *comp = s->img_n;
            return data_00;
          }
          return data_00;
        }
        local_894c = s->img_x * 2 & 2;
LAB_001b2b3f:
        if ((local_88dc.mg != 0 && local_88dc.mr != 0) && local_88dc.mb != 0) {
          iVar15 = stbi__high_bit(local_88dc.mr);
          uVar17 = stbi__bitcount(local_88dc.mr);
          iVar35 = stbi__high_bit(local_88dc.mg);
          uVar32 = stbi__bitcount(local_88dc.mg);
          iVar18 = stbi__high_bit(local_88dc.mb);
          uVar27 = stbi__bitcount(local_88dc.mb);
          iVar155 = stbi__high_bit(local_88dc.ma);
          uVar16 = stbi__bitcount(local_88dc.ma);
          if ((uVar27 < 9 && (uVar32 < 9 && uVar17 < 9)) && uVar16 < 9) {
            iVar15 = iVar15 + -7;
            iVar35 = iVar35 + -7;
            iVar18 = iVar18 + -7;
            iVar155 = iVar155 + -7;
            bVar44 = true;
            bVar7 = false;
            goto LAB_001b2c78;
          }
        }
        free(data_00);
        lVar33 = *in_FS_OFFSET;
        pcVar28 = "bad masks";
        goto LAB_001b1f1f;
      }
LAB_001b3feb:
      lVar33 = *in_FS_OFFSET;
      pcVar28 = "outofmem";
      goto LAB_001b1f1f;
    }
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar23 = s->img_buffer;
      goto LAB_001b1f59;
    }
LAB_001b210f:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_001b2123:
    iVar11 = stbi__gif_test(s);
    if (iVar11 != 0) {
      memset(&local_88a8,0,0x8870);
      data = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar29);
      if (data == (stbi__context *)0x0 || data == s) {
        if (local_88a8.out != (stbi_uc *)0x0) {
          free(local_88a8.out);
        }
        data = (stbi__context *)0x0;
      }
      else {
        *x = local_88a8.w;
        *y = local_88a8.h;
        if ((req_comp & 0xfffffffbU) != 0) {
          data = (stbi__context *)
                 stbi__convert_format((uchar *)data,4,req_comp,local_88a8.w,local_88a8.h);
        }
      }
      free(local_88a8.history);
      local_88a8.out = local_88a8.background;
LAB_001b23d5:
      free(local_88a8.out);
      return data;
    }
    iVar11 = stbi__get16be(s);
    uVar12 = stbi__get16be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if ((uVar12 | iVar11 << 0x10) != 0x38425053) {
      iVar11 = stbi__pic_test(s);
      if (iVar11 != 0) {
        pvVar22 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
        return pvVar22;
      }
      iVar11 = stbi__jpeg_test(s);
      if (iVar11 != 0) {
        pvVar22 = stbi__jpeg_load(s,x,y,comp,req_comp,ri_00);
        return pvVar22;
      }
      iVar11 = stbi__pnm_test(s);
      if (iVar11 != 0) {
        pvVar22 = stbi__pnm_load(s,x,y,comp,req_comp,ri);
        return pvVar22;
      }
      iVar11 = stbi__hdr_test(s);
      if (iVar11 != 0) {
        data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        psVar23 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
        return psVar23;
      }
      iVar11 = stbi__tga_test(s);
      if (iVar11 != 0) {
        pvVar22 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
        return pvVar22;
      }
      lVar33 = *in_FS_OFFSET;
      pcVar28 = "unknown image type";
      goto LAB_001b1f1f;
    }
    iVar11 = stbi__get16be(s);
    uVar12 = stbi__get16be(s);
    if ((uVar12 | iVar11 << 0x10) != 0x38425053) {
      lVar33 = *in_FS_OFFSET;
      pcVar28 = "not PSD";
      goto LAB_001b1f1f;
    }
    iVar11 = stbi__get16be(s);
    if (iVar11 != 1) {
      lVar33 = *in_FS_OFFSET;
      pcVar28 = "wrong version";
      goto LAB_001b1f1f;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
      psVar23 = s->img_buffer;
LAB_001b24a5:
      s->img_buffer = psVar23 + 6;
    }
    else {
      psVar23 = s->img_buffer;
      iVar11 = (int)s->img_buffer_end - (int)psVar23;
      if (5 < iVar11) goto LAB_001b24a5;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar11);
    }
    uVar12 = stbi__get16be(s);
    if (0x10 < uVar12) {
      lVar33 = *in_FS_OFFSET;
      pcVar28 = "wrong channel count";
      goto LAB_001b1f1f;
    }
    iVar11 = stbi__get16be(s);
    uVar16 = iVar11 * 0x10000;
    uVar17 = stbi__get16be(s);
    uVar27 = uVar16 + uVar17;
    iVar11 = stbi__get16be(s);
    uVar32 = stbi__get16be(s);
    if ((int)uVar27 < 0x1000001) {
      uVar42 = iVar11 * 0x10000;
      uVar19 = uVar42 + uVar32;
      if ((int)uVar19 < 0x1000001) {
        iVar11 = stbi__get16be(s);
        if ((iVar11 != 8) && (iVar11 != 0x10)) {
          lVar33 = *in_FS_OFFSET;
          pcVar28 = "unsupported bit depth";
          goto LAB_001b1f1f;
        }
        iVar39 = stbi__get16be(s);
        if (iVar39 != 3) {
          lVar33 = *in_FS_OFFSET;
          pcVar28 = "wrong color format";
          goto LAB_001b1f1f;
        }
        sVar13 = stbi__get32be(s);
        stbi__skip(s,sVar13);
        sVar13 = stbi__get32be(s);
        stbi__skip(s,sVar13);
        sVar13 = stbi__get32be(s);
        stbi__skip(s,sVar13);
        uVar14 = stbi__get16be(s);
        if (1 < uVar14) {
          lVar33 = *in_FS_OFFSET;
          pcVar28 = "bad compression";
          goto LAB_001b1f1f;
        }
        iVar39 = stbi__mad3sizes_valid(4,uVar19,uVar27,0);
        if (iVar39 != 0) {
          if (((bpc == 0x10) && (iVar11 == 0x10)) && (uVar14 == 0)) {
            data_02 = (stbi__uint16 *)stbi__malloc_mad3(8,uVar19,uVar27,0);
            ri->bits_per_channel = 0x10;
          }
          else {
            data_02 = (stbi__uint16 *)malloc((long)(int)(uVar27 * uVar19 * 4));
          }
          if (data_02 != (stbi__uint16 *)0x0) {
            iVar39 = uVar19 * uVar27;
            if (uVar14 == 0) {
              lVar33 = (ulong)((uVar17 | uVar16) * (uVar32 | uVar42)) - 1;
              auVar47._8_4_ = (int)lVar33;
              auVar47._0_8_ = lVar33;
              auVar47._12_4_ = (int)((ulong)lVar33 >> 0x20);
              psVar38 = data_02 + 0x1e;
              uVar14 = (uVar17 + uVar16) * (uVar32 + uVar42);
              psVar43 = data_02 + 0x1c;
              uVar40 = 0;
              auVar131._8_4_ = 0xffffffff;
              auVar131._0_8_ = 0xffffffffffffffff;
              auVar131._12_4_ = 0xffffffff;
              auVar125 = _DAT_00246480;
              local_89a8 = data_02;
              local_8968 = data_02;
              do {
                if (uVar40 < uVar12) {
                  if (ri->bits_per_channel == 0x10) {
                    if (0 < iVar39) {
                      lVar33 = 0;
                      do {
                        iVar15 = stbi__get16be(s);
                        auVar125 = _DAT_00246480;
                        auVar131._8_4_ = 0xffffffff;
                        auVar131._0_8_ = 0xffffffffffffffff;
                        auVar131._12_4_ = 0xffffffff;
                        local_89a8[lVar33 * 4] = (stbi__uint16)iVar15;
                        lVar33 = lVar33 + 1;
                      } while (uVar14 != (uint)lVar33);
                    }
                  }
                  else if (iVar11 == 0x10) {
                    if (0 < iVar39) {
                      lVar33 = 0;
                      do {
                        iVar15 = stbi__get16be(s);
                        auVar125 = _DAT_00246480;
                        auVar131._8_4_ = 0xffffffff;
                        auVar131._0_8_ = 0xffffffffffffffff;
                        auVar131._12_4_ = 0xffffffff;
                        *(char *)(local_8968 + lVar33 * 2) = (char)((uint)iVar15 >> 8);
                        lVar33 = lVar33 + 1;
                      } while (uVar14 - (int)lVar33 != 0);
                    }
                  }
                  else if (0 < iVar39) {
                    psVar23 = s->img_buffer;
                    lVar33 = 0;
                    do {
                      if (psVar23 < s->img_buffer_end) {
LAB_001b484d:
                        s->img_buffer = psVar23 + 1;
                        sVar31 = *psVar23;
                        psVar23 = psVar23 + 1;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          auVar131._8_4_ = 0xffffffff;
                          auVar131._0_8_ = 0xffffffffffffffff;
                          auVar131._12_4_ = 0xffffffff;
                          psVar23 = s->img_buffer;
                          auVar125 = _DAT_00246480;
                          goto LAB_001b484d;
                        }
                        sVar31 = '\0';
                      }
                      *(stbi_uc *)(local_8968 + lVar33 * 2) = sVar31;
                      lVar33 = lVar33 + 1;
                    } while (uVar14 - (int)lVar33 != 0);
                  }
                }
                else if (iVar11 == 0x10 && bpc == 0x10) {
                  if (0 < iVar39) {
                    sVar10 = -(ushort)(uVar40 == 3);
                    uVar41 = 0;
                    do {
                      auVar48._8_4_ = (int)uVar41;
                      auVar48._0_8_ = uVar41;
                      auVar48._12_4_ = (int)(uVar41 >> 0x20);
                      auVar56 = auVar47 ^ auVar125;
                      auVar77 = (auVar48 | _DAT_0024dd10) ^ auVar125;
                      iVar15 = auVar56._0_4_;
                      iVar159 = -(uint)(iVar15 < auVar77._0_4_);
                      iVar35 = auVar56._4_4_;
                      auVar79._4_4_ = -(uint)(iVar35 < auVar77._4_4_);
                      iVar18 = auVar56._8_4_;
                      iVar124 = -(uint)(iVar18 < auVar77._8_4_);
                      iVar155 = auVar56._12_4_;
                      auVar79._12_4_ = -(uint)(iVar155 < auVar77._12_4_);
                      auVar104._4_4_ = iVar159;
                      auVar104._0_4_ = iVar159;
                      auVar104._8_4_ = iVar124;
                      auVar104._12_4_ = iVar124;
                      auVar56 = pshuflw(in_XMM5,auVar104,0xe8);
                      auVar78._4_4_ = -(uint)(auVar77._4_4_ == iVar35);
                      auVar78._12_4_ = -(uint)(auVar77._12_4_ == iVar155);
                      auVar78._0_4_ = auVar78._4_4_;
                      auVar78._8_4_ = auVar78._12_4_;
                      auVar129 = pshuflw(in_XMM6,auVar78,0xe8);
                      auVar79._0_4_ = auVar79._4_4_;
                      auVar79._8_4_ = auVar79._12_4_;
                      auVar77 = pshuflw(auVar56,auVar79,0xe8);
                      auVar77 = (auVar77 | auVar129 & auVar56) ^ auVar131;
                      auVar77 = packssdw(auVar77,auVar77);
                      if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        psVar43[uVar41 * 4 + 0xffffffffffffffe4] = sVar10;
                      }
                      auVar79 = auVar78 & auVar104 | auVar79;
                      auVar77 = packssdw(auVar79,auVar79);
                      auVar77 = packssdw(auVar77 ^ auVar131,auVar77 ^ auVar131);
                      if ((auVar77._0_4_ >> 0x10 & 1) != 0) {
                        psVar43[uVar41 * 4 + 0xffffffffffffffe8] = sVar10;
                      }
                      auVar77 = (auVar48 | _DAT_0024dd00) ^ auVar125;
                      iVar159 = -(uint)(iVar15 < auVar77._0_4_);
                      auVar120._4_4_ = -(uint)(iVar35 < auVar77._4_4_);
                      iVar124 = -(uint)(iVar18 < auVar77._8_4_);
                      auVar120._12_4_ = -(uint)(iVar155 < auVar77._12_4_);
                      auVar80._4_4_ = iVar159;
                      auVar80._0_4_ = iVar159;
                      auVar80._8_4_ = iVar124;
                      auVar80._12_4_ = iVar124;
                      auVar105._4_4_ = -(uint)(auVar77._4_4_ == iVar35);
                      auVar105._12_4_ = -(uint)(auVar77._12_4_ == iVar155);
                      auVar105._0_4_ = auVar105._4_4_;
                      auVar105._8_4_ = auVar105._12_4_;
                      auVar120._0_4_ = auVar120._4_4_;
                      auVar120._8_4_ = auVar120._12_4_;
                      auVar77 = auVar105 & auVar80 | auVar120;
                      auVar77 = packssdw(auVar77,auVar77);
                      auVar77 = packssdw(auVar77 ^ auVar131,auVar77 ^ auVar131);
                      if ((auVar77 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        psVar43[uVar41 * 4 + 0xffffffffffffffec] = sVar10;
                      }
                      auVar81 = pshufhw(auVar80,auVar80,0x84);
                      auVar54 = pshufhw(auVar105,auVar105,0x84);
                      auVar82 = pshufhw(auVar81,auVar120,0x84);
                      auVar81 = (auVar82 | auVar54 & auVar81) ^ auVar131;
                      auVar81 = packssdw(auVar81,auVar81);
                      if ((auVar81 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        psVar43[uVar41 * 4 + 0xfffffffffffffff0] = sVar10;
                      }
                      auVar81 = (auVar48 | _DAT_0024f2f0) ^ auVar125;
                      iVar159 = -(uint)(iVar15 < auVar81._0_4_);
                      auVar84._4_4_ = -(uint)(iVar35 < auVar81._4_4_);
                      iVar124 = -(uint)(iVar18 < auVar81._8_4_);
                      auVar84._12_4_ = -(uint)(iVar155 < auVar81._12_4_);
                      auVar106._4_4_ = iVar159;
                      auVar106._0_4_ = iVar159;
                      auVar106._8_4_ = iVar124;
                      auVar106._12_4_ = iVar124;
                      auVar77 = pshuflw(auVar77,auVar106,0xe8);
                      auVar83._4_4_ = -(uint)(auVar81._4_4_ == iVar35);
                      auVar83._12_4_ = -(uint)(auVar81._12_4_ == iVar155);
                      auVar83._0_4_ = auVar83._4_4_;
                      auVar83._8_4_ = auVar83._12_4_;
                      in_XMM6 = pshuflw(auVar129 & auVar56,auVar83,0xe8);
                      in_XMM6 = in_XMM6 & auVar77;
                      auVar84._0_4_ = auVar84._4_4_;
                      auVar84._8_4_ = auVar84._12_4_;
                      auVar56 = pshuflw(auVar77,auVar84,0xe8);
                      auVar56 = (auVar56 | in_XMM6) ^ auVar131;
                      in_XMM5 = packssdw(auVar56,auVar56);
                      if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        psVar43[uVar41 * 4 + 0xfffffffffffffff4] = sVar10;
                      }
                      auVar84 = auVar83 & auVar106 | auVar84;
                      auVar56 = packssdw(auVar84,auVar84);
                      auVar56 = packssdw(auVar56 ^ auVar131,auVar56 ^ auVar131);
                      if ((auVar56 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        psVar43[uVar41 * 4 + 0xfffffffffffffff8] = sVar10;
                      }
                      auVar56 = (auVar48 | _DAT_0024f2e0) ^ auVar125;
                      auVar107._0_4_ = -(uint)(iVar15 < auVar56._0_4_);
                      auVar107._4_4_ = -(uint)(iVar35 < auVar56._4_4_);
                      auVar107._8_4_ = -(uint)(iVar18 < auVar56._8_4_);
                      auVar107._12_4_ = -(uint)(iVar155 < auVar56._12_4_);
                      auVar85._4_4_ = auVar107._0_4_;
                      auVar85._0_4_ = auVar107._0_4_;
                      auVar85._8_4_ = auVar107._8_4_;
                      auVar85._12_4_ = auVar107._8_4_;
                      auVar49._4_4_ = -(uint)(auVar56._4_4_ == iVar35);
                      auVar49._12_4_ = -(uint)(auVar56._12_4_ == iVar155);
                      auVar49._0_4_ = auVar49._4_4_;
                      auVar49._8_4_ = auVar49._12_4_;
                      auVar57._4_4_ = auVar107._4_4_;
                      auVar57._0_4_ = auVar107._4_4_;
                      auVar57._8_4_ = auVar107._12_4_;
                      auVar57._12_4_ = auVar107._12_4_;
                      auVar56 = packssdw(auVar107,auVar49 & auVar85 | auVar57);
                      auVar56 = packssdw(auVar56 ^ auVar131,auVar56 ^ auVar131);
                      if ((auVar56 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        psVar43[uVar41 * 4 + 0xfffffffffffffffc] = sVar10;
                      }
                      auVar129 = pshufhw(auVar85,auVar85,0x84);
                      auVar56 = pshufhw(auVar49,auVar49,0x84);
                      auVar77 = pshufhw(auVar57,auVar57,0x84);
                      auVar56 = packssdw(auVar56 & auVar129,
                                         (auVar77 | auVar56 & auVar129) ^ auVar131);
                      if ((auVar56 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        psVar43[uVar41 * 4] = sVar10;
                      }
                      uVar41 = uVar41 + 8;
                    } while (((ulong)uVar14 + 7 & 0xfffffffffffffff8) != uVar41);
                  }
                }
                else if (0 < iVar39) {
                  cVar9 = -(uVar40 == 3);
                  uVar41 = 0;
                  do {
                    auVar56._8_4_ = (int)uVar41;
                    auVar56._0_8_ = uVar41;
                    auVar56._12_4_ = (int)(uVar41 >> 0x20);
                    auVar77 = auVar47 ^ auVar125;
                    auVar129 = (auVar56 | _DAT_0024dd10) ^ auVar125;
                    iVar15 = auVar77._0_4_;
                    iVar159 = -(uint)(iVar15 < auVar129._0_4_);
                    iVar35 = auVar77._4_4_;
                    auVar81._4_4_ = -(uint)(iVar35 < auVar129._4_4_);
                    iVar18 = auVar77._8_4_;
                    iVar124 = -(uint)(iVar18 < auVar129._8_4_);
                    iVar155 = auVar77._12_4_;
                    auVar81._12_4_ = -(uint)(iVar155 < auVar129._12_4_);
                    auVar108._4_4_ = iVar159;
                    auVar108._0_4_ = iVar159;
                    auVar108._8_4_ = iVar124;
                    auVar108._12_4_ = iVar124;
                    auVar82 = pshuflw(in_XMM5,auVar108,0xe8);
                    auVar77._4_4_ = -(uint)(auVar129._4_4_ == iVar35);
                    auVar77._12_4_ = -(uint)(auVar129._12_4_ == iVar155);
                    auVar77._0_4_ = auVar77._4_4_;
                    auVar77._8_4_ = auVar77._12_4_;
                    auVar54 = pshuflw(in_XMM6,auVar77,0xe8);
                    auVar81._0_4_ = auVar81._4_4_;
                    auVar81._8_4_ = auVar81._12_4_;
                    auVar129 = pshuflw(auVar82,auVar81,0xe8);
                    auVar129 = (auVar129 | auVar54 & auVar82) ^ auVar131;
                    auVar129 = packssdw(auVar129,auVar129);
                    if ((auVar129 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar38 + uVar41 * 2 + 0xffffffffffffffe2) = cVar9;
                    }
                    auVar81 = auVar77 & auVar108 | auVar81;
                    auVar77 = packssdw(auVar81,auVar81);
                    auVar77 = packssdw(auVar77 ^ auVar131,auVar77 ^ auVar131);
                    auVar77 = packsswb(auVar77,auVar77);
                    if ((auVar77._0_4_ >> 8 & 1) != 0) {
                      *(char *)(psVar38 + uVar41 * 2 + 0xffffffffffffffe4) = cVar9;
                    }
                    auVar77 = (auVar56 | _DAT_0024dd00) ^ auVar125;
                    iVar159 = -(uint)(iVar15 < auVar77._0_4_);
                    auVar121._4_4_ = -(uint)(iVar35 < auVar77._4_4_);
                    iVar124 = -(uint)(iVar18 < auVar77._8_4_);
                    auVar121._12_4_ = -(uint)(iVar155 < auVar77._12_4_);
                    auVar129._4_4_ = iVar159;
                    auVar129._0_4_ = iVar159;
                    auVar129._8_4_ = iVar124;
                    auVar129._12_4_ = iVar124;
                    auVar109._4_4_ = -(uint)(auVar77._4_4_ == iVar35);
                    auVar109._12_4_ = -(uint)(auVar77._12_4_ == iVar155);
                    auVar109._0_4_ = auVar109._4_4_;
                    auVar109._8_4_ = auVar109._12_4_;
                    auVar121._0_4_ = auVar121._4_4_;
                    auVar121._8_4_ = auVar121._12_4_;
                    auVar77 = auVar109 & auVar129 | auVar121;
                    auVar77 = packssdw(auVar77,auVar77);
                    auVar77 = packssdw(auVar77 ^ auVar131,auVar77 ^ auVar131);
                    auVar77 = packsswb(auVar77,auVar77);
                    if ((auVar77._0_4_ >> 0x10 & 1) != 0) {
                      *(char *)(psVar38 + uVar41 * 2 + 0xffffffffffffffe6) = cVar9;
                    }
                    auVar129 = pshufhw(auVar129,auVar129,0x84);
                    auVar134 = pshufhw(auVar109,auVar109,0x84);
                    auVar81 = pshufhw(auVar129,auVar121,0x84);
                    auVar129 = (auVar81 | auVar134 & auVar129) ^ auVar131;
                    auVar129 = packssdw(auVar129,auVar129);
                    auVar129 = packsswb(auVar129,auVar129);
                    if ((auVar129._0_4_ >> 0x18 & 1) != 0) {
                      *(char *)(psVar38 + uVar41 * 2 + 0xffffffffffffffe8) = cVar9;
                    }
                    auVar129 = (auVar56 | _DAT_0024f2f0) ^ auVar125;
                    iVar159 = -(uint)(iVar15 < auVar129._0_4_);
                    auVar87._4_4_ = -(uint)(iVar35 < auVar129._4_4_);
                    iVar124 = -(uint)(iVar18 < auVar129._8_4_);
                    auVar87._12_4_ = -(uint)(iVar155 < auVar129._12_4_);
                    auVar110._4_4_ = iVar159;
                    auVar110._0_4_ = iVar159;
                    auVar110._8_4_ = iVar124;
                    auVar110._12_4_ = iVar124;
                    auVar77 = pshuflw(auVar77,auVar110,0xe8);
                    auVar86._4_4_ = -(uint)(auVar129._4_4_ == iVar35);
                    auVar86._12_4_ = -(uint)(auVar129._12_4_ == iVar155);
                    auVar86._0_4_ = auVar86._4_4_;
                    auVar86._8_4_ = auVar86._12_4_;
                    auVar81 = pshuflw(auVar54 & auVar82,auVar86,0xe8);
                    auVar87._0_4_ = auVar87._4_4_;
                    auVar87._8_4_ = auVar87._12_4_;
                    auVar129 = pshuflw(auVar77,auVar87,0xe8);
                    auVar129 = (auVar129 | auVar81 & auVar77) ^ auVar131;
                    auVar129 = packssdw(auVar129,auVar129);
                    auVar129 = packsswb(auVar129,auVar129);
                    if ((auVar129 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar38 + uVar41 * 2 + 0xffffffffffffffea) = cVar9;
                    }
                    auVar87 = auVar86 & auVar110 | auVar87;
                    auVar129 = packssdw(auVar87,auVar87);
                    auVar129 = packssdw(auVar129 ^ auVar131,auVar129 ^ auVar131);
                    auVar129 = packsswb(auVar129,auVar129);
                    if ((auVar129._4_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar38 + uVar41 * 2 + 0xffffffffffffffec) = cVar9;
                    }
                    auVar129 = (auVar56 | _DAT_0024f2e0) ^ auVar125;
                    iVar159 = -(uint)(iVar15 < auVar129._0_4_);
                    auVar122._4_4_ = -(uint)(iVar35 < auVar129._4_4_);
                    iVar124 = -(uint)(iVar18 < auVar129._8_4_);
                    auVar122._12_4_ = -(uint)(iVar155 < auVar129._12_4_);
                    auVar88._4_4_ = iVar159;
                    auVar88._0_4_ = iVar159;
                    auVar88._8_4_ = iVar124;
                    auVar88._12_4_ = iVar124;
                    auVar111._4_4_ = -(uint)(auVar129._4_4_ == iVar35);
                    auVar111._12_4_ = -(uint)(auVar129._12_4_ == iVar155);
                    auVar111._0_4_ = auVar111._4_4_;
                    auVar111._8_4_ = auVar111._12_4_;
                    auVar122._0_4_ = auVar122._4_4_;
                    auVar122._8_4_ = auVar122._12_4_;
                    auVar129 = auVar111 & auVar88 | auVar122;
                    auVar129 = packssdw(auVar129,auVar129);
                    auVar129 = packssdw(auVar129 ^ auVar131,auVar129 ^ auVar131);
                    auVar129 = packsswb(auVar129,auVar129);
                    if ((auVar129 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar38 + uVar41 * 2 + 0xffffffffffffffee) = cVar9;
                    }
                    auVar82 = pshufhw(auVar88,auVar88,0x84);
                    auVar134 = pshufhw(auVar111,auVar111,0x84);
                    auVar54 = pshufhw(auVar82,auVar122,0x84);
                    auVar82 = (auVar54 | auVar134 & auVar82) ^ auVar131;
                    auVar82 = packssdw(auVar82,auVar82);
                    auVar82 = packsswb(auVar82,auVar82);
                    if ((auVar82._6_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar38 + uVar41 * 2 + 0xfffffffffffffff0) = cVar9;
                    }
                    auVar82 = (auVar56 | _DAT_0024f2d0) ^ auVar125;
                    iVar159 = -(uint)(iVar15 < auVar82._0_4_);
                    auVar90._4_4_ = -(uint)(iVar35 < auVar82._4_4_);
                    iVar124 = -(uint)(iVar18 < auVar82._8_4_);
                    auVar90._12_4_ = -(uint)(iVar155 < auVar82._12_4_);
                    auVar112._4_4_ = iVar159;
                    auVar112._0_4_ = iVar159;
                    auVar112._8_4_ = iVar124;
                    auVar112._12_4_ = iVar124;
                    auVar129 = pshuflw(auVar129,auVar112,0xe8);
                    auVar89._4_4_ = -(uint)(auVar82._4_4_ == iVar35);
                    auVar89._12_4_ = -(uint)(auVar82._12_4_ == iVar155);
                    auVar89._0_4_ = auVar89._4_4_;
                    auVar89._8_4_ = auVar89._12_4_;
                    auVar81 = pshuflw(auVar81 & auVar77,auVar89,0xe8);
                    auVar90._0_4_ = auVar90._4_4_;
                    auVar90._8_4_ = auVar90._12_4_;
                    auVar77 = pshuflw(auVar129,auVar90,0xe8);
                    auVar77 = (auVar77 | auVar81 & auVar129) ^ auVar131;
                    auVar77 = packssdw(auVar77,auVar77);
                    auVar77 = packsswb(auVar77,auVar77);
                    if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar38 + uVar41 * 2 + 0xfffffffffffffff2) = cVar9;
                    }
                    auVar90 = auVar89 & auVar112 | auVar90;
                    auVar77 = packssdw(auVar90,auVar90);
                    auVar77 = packssdw(auVar77 ^ auVar131,auVar77 ^ auVar131);
                    auVar77 = packsswb(auVar77,auVar77);
                    if ((auVar77._8_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar38 + uVar41 * 2 + 0xfffffffffffffff4) = cVar9;
                    }
                    auVar77 = (auVar56 | _DAT_0024f2c0) ^ auVar125;
                    iVar159 = -(uint)(iVar15 < auVar77._0_4_);
                    auVar123._4_4_ = -(uint)(iVar35 < auVar77._4_4_);
                    iVar124 = -(uint)(iVar18 < auVar77._8_4_);
                    auVar123._12_4_ = -(uint)(iVar155 < auVar77._12_4_);
                    auVar91._4_4_ = iVar159;
                    auVar91._0_4_ = iVar159;
                    auVar91._8_4_ = iVar124;
                    auVar91._12_4_ = iVar124;
                    auVar113._4_4_ = -(uint)(auVar77._4_4_ == iVar35);
                    auVar113._12_4_ = -(uint)(auVar77._12_4_ == iVar155);
                    auVar113._0_4_ = auVar113._4_4_;
                    auVar113._8_4_ = auVar113._12_4_;
                    auVar123._0_4_ = auVar123._4_4_;
                    auVar123._8_4_ = auVar123._12_4_;
                    auVar77 = auVar113 & auVar91 | auVar123;
                    auVar77 = packssdw(auVar77,auVar77);
                    auVar77 = packssdw(auVar77 ^ auVar131,auVar77 ^ auVar131);
                    auVar77 = packsswb(auVar77,auVar77);
                    if ((auVar77 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      *(char *)(psVar38 + uVar41 * 2 + 0xfffffffffffffff6) = cVar9;
                    }
                    auVar82 = pshufhw(auVar91,auVar91,0x84);
                    auVar134 = pshufhw(auVar113,auVar113,0x84);
                    auVar54 = pshufhw(auVar82,auVar123,0x84);
                    auVar82 = (auVar54 | auVar134 & auVar82) ^ auVar131;
                    auVar82 = packssdw(auVar82,auVar82);
                    auVar82 = packsswb(auVar82,auVar82);
                    if ((auVar82._10_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar38 + uVar41 * 2 + 0xfffffffffffffff8) = cVar9;
                    }
                    auVar82 = (auVar56 | _DAT_0024f2b0) ^ auVar125;
                    iVar159 = -(uint)(iVar15 < auVar82._0_4_);
                    auVar93._4_4_ = -(uint)(iVar35 < auVar82._4_4_);
                    iVar124 = -(uint)(iVar18 < auVar82._8_4_);
                    auVar93._12_4_ = -(uint)(iVar155 < auVar82._12_4_);
                    auVar114._4_4_ = iVar159;
                    auVar114._0_4_ = iVar159;
                    auVar114._8_4_ = iVar124;
                    auVar114._12_4_ = iVar124;
                    auVar77 = pshuflw(auVar77,auVar114,0xe8);
                    auVar92._4_4_ = -(uint)(auVar82._4_4_ == iVar35);
                    auVar92._12_4_ = -(uint)(auVar82._12_4_ == iVar155);
                    auVar92._0_4_ = auVar92._4_4_;
                    auVar92._8_4_ = auVar92._12_4_;
                    in_XMM6 = pshuflw(auVar81 & auVar129,auVar92,0xe8);
                    in_XMM6 = in_XMM6 & auVar77;
                    auVar93._0_4_ = auVar93._4_4_;
                    auVar93._8_4_ = auVar93._12_4_;
                    auVar77 = pshuflw(auVar77,auVar93,0xe8);
                    auVar77 = (auVar77 | in_XMM6) ^ auVar131;
                    auVar77 = packssdw(auVar77,auVar77);
                    in_XMM5 = packsswb(auVar77,auVar77);
                    if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar38 + uVar41 * 2 + 0xfffffffffffffffa) = cVar9;
                    }
                    auVar93 = auVar92 & auVar114 | auVar93;
                    auVar77 = packssdw(auVar93,auVar93);
                    auVar77 = packssdw(auVar77 ^ auVar131,auVar77 ^ auVar131);
                    auVar77 = packsswb(auVar77,auVar77);
                    if ((auVar77._12_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar38 + uVar41 * 2 + 0xfffffffffffffffc) = cVar9;
                    }
                    auVar56 = (auVar56 | _DAT_0024f2a0) ^ auVar125;
                    auVar115._0_4_ = -(uint)(iVar15 < auVar56._0_4_);
                    auVar115._4_4_ = -(uint)(iVar35 < auVar56._4_4_);
                    auVar115._8_4_ = -(uint)(iVar18 < auVar56._8_4_);
                    auVar115._12_4_ = -(uint)(iVar155 < auVar56._12_4_);
                    auVar94._4_4_ = auVar115._0_4_;
                    auVar94._0_4_ = auVar115._0_4_;
                    auVar94._8_4_ = auVar115._8_4_;
                    auVar94._12_4_ = auVar115._8_4_;
                    auVar50._4_4_ = -(uint)(auVar56._4_4_ == iVar35);
                    auVar50._12_4_ = -(uint)(auVar56._12_4_ == iVar155);
                    auVar50._0_4_ = auVar50._4_4_;
                    auVar50._8_4_ = auVar50._12_4_;
                    auVar58._4_4_ = auVar115._4_4_;
                    auVar58._0_4_ = auVar115._4_4_;
                    auVar58._8_4_ = auVar115._12_4_;
                    auVar58._12_4_ = auVar115._12_4_;
                    auVar56 = packssdw(auVar115,auVar50 & auVar94 | auVar58);
                    auVar56 = packssdw(auVar56 ^ auVar131,auVar56 ^ auVar131);
                    auVar56 = packsswb(auVar56,auVar56);
                    if ((auVar56 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar38 + uVar41 * 2 + 0xfffffffffffffffe) = cVar9;
                    }
                    auVar129 = pshufhw(auVar94,auVar94,0x84);
                    auVar56 = pshufhw(auVar50,auVar50,0x84);
                    auVar77 = pshufhw(auVar58,auVar58,0x84);
                    auVar56 = packssdw(auVar56 & auVar129,(auVar77 | auVar56 & auVar129) ^ auVar131)
                    ;
                    auVar56 = packsswb(auVar56,auVar56);
                    if ((auVar56._14_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar38 + uVar41 * 2) = cVar9;
                    }
                    uVar41 = uVar41 + 0x10;
                  } while (((ulong)uVar14 + 0xf & 0xfffffffffffffff0) != uVar41);
                }
                uVar40 = uVar40 + 1;
                psVar38 = (stbi__uint16 *)((long)psVar38 + 1);
                psVar43 = psVar43 + 1;
                local_8968 = (stbi__uint16 *)((long)local_8968 + 1);
                local_89a8 = local_89a8 + 1;
              } while (uVar40 != 4);
            }
            else {
              stbi__skip(s,uVar12 * uVar27 * 2);
              lVar33 = (ulong)((uVar17 | uVar16) * (uVar32 | uVar42)) - 1;
              auVar130._8_4_ = (int)lVar33;
              auVar130._0_8_ = lVar33;
              auVar130._12_4_ = (int)((ulong)lVar33 >> 0x20);
              psVar43 = data_02 + 0x1e;
              uVar40 = 0;
              auVar125 = _DAT_0024f2a0;
              auVar47 = _DAT_0024f2b0;
              auVar131 = _DAT_0024f2c0;
              auVar56 = _DAT_0024f2d0;
              auVar77 = _DAT_0024f2e0;
              auVar129 = _DAT_0024f2f0;
              auVar81 = _DAT_0024dd00;
              auVar82 = _DAT_0024dd10;
              do {
                if (uVar40 < uVar12) {
                  iVar11 = stbi__psd_decode_rle(s,(stbi_uc *)((long)data_02 + uVar40),iVar39);
                  auVar125 = _DAT_0024f2a0;
                  auVar47 = _DAT_0024f2b0;
                  auVar131 = _DAT_0024f2c0;
                  auVar56 = _DAT_0024f2d0;
                  auVar77 = _DAT_0024f2e0;
                  auVar129 = _DAT_0024f2f0;
                  auVar81 = _DAT_0024dd00;
                  auVar82 = _DAT_0024dd10;
                  if (iVar11 == 0) {
                    free(data_02);
                    lVar33 = *in_FS_OFFSET;
                    pcVar28 = "corrupt";
                    goto LAB_001b1f1f;
                  }
                }
                else if (0 < iVar39) {
                  cVar9 = -(uVar40 == 3);
                  uVar41 = 0;
                  do {
                    auVar45._8_4_ = (int)uVar41;
                    auVar45._0_8_ = uVar41;
                    auVar45._12_4_ = (int)(uVar41 >> 0x20);
                    auVar54 = auVar130 ^ _DAT_00246480;
                    auVar134 = (auVar45 | auVar82) ^ _DAT_00246480;
                    iVar11 = auVar54._0_4_;
                    iVar155 = -(uint)(iVar11 < auVar134._0_4_);
                    iVar15 = auVar54._4_4_;
                    auVar66._4_4_ = -(uint)(iVar15 < auVar134._4_4_);
                    iVar35 = auVar54._8_4_;
                    iVar159 = -(uint)(iVar35 < auVar134._8_4_);
                    iVar18 = auVar54._12_4_;
                    auVar66._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
                    auVar96._4_4_ = iVar155;
                    auVar96._0_4_ = iVar155;
                    auVar96._8_4_ = iVar159;
                    auVar96._12_4_ = iVar159;
                    auVar54 = pshuflw(in_XMM5,auVar96,0xe8);
                    auVar65._4_4_ = -(uint)(auVar134._4_4_ == iVar15);
                    auVar65._12_4_ = -(uint)(auVar134._12_4_ == iVar18);
                    auVar65._0_4_ = auVar65._4_4_;
                    auVar65._8_4_ = auVar65._12_4_;
                    auVar136 = pshuflw(in_XMM6,auVar65,0xe8);
                    auVar66._0_4_ = auVar66._4_4_;
                    auVar66._8_4_ = auVar66._12_4_;
                    auVar134 = pshuflw(auVar54,auVar66,0xe8);
                    auVar126._8_4_ = 0xffffffff;
                    auVar126._0_8_ = 0xffffffffffffffff;
                    auVar126._12_4_ = 0xffffffff;
                    auVar54 = (auVar134 | auVar136 & auVar54) ^ auVar126;
                    auVar54 = packssdw(auVar54,auVar54);
                    if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar43 + uVar41 * 2 + 0xffffffffffffffe2) = cVar9;
                    }
                    auVar66 = auVar65 & auVar96 | auVar66;
                    auVar54 = packssdw(auVar66,auVar66);
                    auVar54 = packssdw(auVar54 ^ auVar126,auVar54 ^ auVar126);
                    auVar54 = packsswb(auVar54,auVar54);
                    if ((auVar54._0_4_ >> 8 & 1) != 0) {
                      *(char *)(psVar43 + uVar41 * 2 + 0xffffffffffffffe4) = cVar9;
                    }
                    auVar54 = (auVar45 | auVar81) ^ _DAT_00246480;
                    iVar155 = -(uint)(iVar11 < auVar54._0_4_);
                    auVar117._4_4_ = -(uint)(iVar15 < auVar54._4_4_);
                    iVar159 = -(uint)(iVar35 < auVar54._8_4_);
                    auVar117._12_4_ = -(uint)(iVar18 < auVar54._12_4_);
                    auVar67._4_4_ = iVar155;
                    auVar67._0_4_ = iVar155;
                    auVar67._8_4_ = iVar159;
                    auVar67._12_4_ = iVar159;
                    auVar97._4_4_ = -(uint)(auVar54._4_4_ == iVar15);
                    auVar97._12_4_ = -(uint)(auVar54._12_4_ == iVar18);
                    auVar97._0_4_ = auVar97._4_4_;
                    auVar97._8_4_ = auVar97._12_4_;
                    auVar117._0_4_ = auVar117._4_4_;
                    auVar117._8_4_ = auVar117._12_4_;
                    auVar54 = auVar97 & auVar67 | auVar117;
                    auVar54 = packssdw(auVar54,auVar54);
                    auVar54 = packssdw(auVar54 ^ auVar126,auVar54 ^ auVar126);
                    auVar54 = packsswb(auVar54,auVar54);
                    if ((auVar54._0_4_ >> 0x10 & 1) != 0) {
                      *(char *)(psVar43 + uVar41 * 2 + 0xffffffffffffffe6) = cVar9;
                    }
                    auVar134 = pshufhw(auVar67,auVar67,0x84);
                    auVar59 = pshufhw(auVar97,auVar97,0x84);
                    auVar136 = pshufhw(auVar134,auVar117,0x84);
                    auVar134 = (auVar136 | auVar59 & auVar134) ^ auVar126;
                    auVar134 = packssdw(auVar134,auVar134);
                    auVar134 = packsswb(auVar134,auVar134);
                    if ((auVar134._0_4_ >> 0x18 & 1) != 0) {
                      *(char *)(psVar43 + uVar41 * 2 + 0xffffffffffffffe8) = cVar9;
                    }
                    auVar134 = (auVar45 | auVar129) ^ _DAT_00246480;
                    iVar155 = -(uint)(iVar11 < auVar134._0_4_);
                    auVar69._4_4_ = -(uint)(iVar15 < auVar134._4_4_);
                    iVar159 = -(uint)(iVar35 < auVar134._8_4_);
                    auVar69._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
                    auVar98._4_4_ = iVar155;
                    auVar98._0_4_ = iVar155;
                    auVar98._8_4_ = iVar159;
                    auVar98._12_4_ = iVar159;
                    auVar54 = pshuflw(auVar54,auVar98,0xe8);
                    auVar68._4_4_ = -(uint)(auVar134._4_4_ == iVar15);
                    auVar68._12_4_ = -(uint)(auVar134._12_4_ == iVar18);
                    auVar68._0_4_ = auVar68._4_4_;
                    auVar68._8_4_ = auVar68._12_4_;
                    auVar136 = pshuflw(auVar126,auVar68,0xe8);
                    auVar69._0_4_ = auVar69._4_4_;
                    auVar69._8_4_ = auVar69._12_4_;
                    auVar134 = pshuflw(auVar54,auVar69,0xe8);
                    auVar127._8_4_ = 0xffffffff;
                    auVar127._0_8_ = 0xffffffffffffffff;
                    auVar127._12_4_ = 0xffffffff;
                    auVar54 = (auVar134 | auVar136 & auVar54) ^ auVar127;
                    auVar54 = packssdw(auVar54,auVar54);
                    auVar54 = packsswb(auVar54,auVar54);
                    if ((auVar54 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar43 + uVar41 * 2 + 0xffffffffffffffea) = cVar9;
                    }
                    auVar69 = auVar68 & auVar98 | auVar69;
                    auVar54 = packssdw(auVar69,auVar69);
                    auVar54 = packssdw(auVar54 ^ auVar127,auVar54 ^ auVar127);
                    auVar54 = packsswb(auVar54,auVar54);
                    if ((auVar54._4_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar43 + uVar41 * 2 + 0xffffffffffffffec) = cVar9;
                    }
                    auVar54 = (auVar45 | auVar77) ^ _DAT_00246480;
                    iVar155 = -(uint)(iVar11 < auVar54._0_4_);
                    auVar118._4_4_ = -(uint)(iVar15 < auVar54._4_4_);
                    iVar159 = -(uint)(iVar35 < auVar54._8_4_);
                    auVar118._12_4_ = -(uint)(iVar18 < auVar54._12_4_);
                    auVar70._4_4_ = iVar155;
                    auVar70._0_4_ = iVar155;
                    auVar70._8_4_ = iVar159;
                    auVar70._12_4_ = iVar159;
                    auVar99._4_4_ = -(uint)(auVar54._4_4_ == iVar15);
                    auVar99._12_4_ = -(uint)(auVar54._12_4_ == iVar18);
                    auVar99._0_4_ = auVar99._4_4_;
                    auVar99._8_4_ = auVar99._12_4_;
                    auVar118._0_4_ = auVar118._4_4_;
                    auVar118._8_4_ = auVar118._12_4_;
                    auVar54 = auVar99 & auVar70 | auVar118;
                    auVar54 = packssdw(auVar54,auVar54);
                    auVar54 = packssdw(auVar54 ^ auVar127,auVar54 ^ auVar127);
                    auVar54 = packsswb(auVar54,auVar54);
                    if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar43 + uVar41 * 2 + 0xffffffffffffffee) = cVar9;
                    }
                    auVar134 = pshufhw(auVar70,auVar70,0x84);
                    auVar59 = pshufhw(auVar99,auVar99,0x84);
                    auVar136 = pshufhw(auVar134,auVar118,0x84);
                    auVar134 = (auVar136 | auVar59 & auVar134) ^ auVar127;
                    auVar134 = packssdw(auVar134,auVar134);
                    auVar134 = packsswb(auVar134,auVar134);
                    if ((auVar134._6_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar43 + uVar41 * 2 + 0xfffffffffffffff0) = cVar9;
                    }
                    auVar134 = (auVar45 | auVar56) ^ _DAT_00246480;
                    iVar155 = -(uint)(iVar11 < auVar134._0_4_);
                    auVar72._4_4_ = -(uint)(iVar15 < auVar134._4_4_);
                    iVar159 = -(uint)(iVar35 < auVar134._8_4_);
                    auVar72._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
                    auVar100._4_4_ = iVar155;
                    auVar100._0_4_ = iVar155;
                    auVar100._8_4_ = iVar159;
                    auVar100._12_4_ = iVar159;
                    auVar54 = pshuflw(auVar54,auVar100,0xe8);
                    auVar71._4_4_ = -(uint)(auVar134._4_4_ == iVar15);
                    auVar71._12_4_ = -(uint)(auVar134._12_4_ == iVar18);
                    auVar71._0_4_ = auVar71._4_4_;
                    auVar71._8_4_ = auVar71._12_4_;
                    auVar136 = pshuflw(auVar127,auVar71,0xe8);
                    auVar72._0_4_ = auVar72._4_4_;
                    auVar72._8_4_ = auVar72._12_4_;
                    auVar134 = pshuflw(auVar54,auVar72,0xe8);
                    auVar128._8_4_ = 0xffffffff;
                    auVar128._0_8_ = 0xffffffffffffffff;
                    auVar128._12_4_ = 0xffffffff;
                    auVar54 = (auVar134 | auVar136 & auVar54) ^ auVar128;
                    auVar54 = packssdw(auVar54,auVar54);
                    auVar54 = packsswb(auVar54,auVar54);
                    if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar43 + uVar41 * 2 + 0xfffffffffffffff2) = cVar9;
                    }
                    auVar72 = auVar71 & auVar100 | auVar72;
                    auVar54 = packssdw(auVar72,auVar72);
                    auVar54 = packssdw(auVar54 ^ auVar128,auVar54 ^ auVar128);
                    auVar54 = packsswb(auVar54,auVar54);
                    if ((auVar54._8_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar43 + uVar41 * 2 + 0xfffffffffffffff4) = cVar9;
                    }
                    auVar54 = (auVar45 | auVar131) ^ _DAT_00246480;
                    iVar155 = -(uint)(iVar11 < auVar54._0_4_);
                    auVar119._4_4_ = -(uint)(iVar15 < auVar54._4_4_);
                    iVar159 = -(uint)(iVar35 < auVar54._8_4_);
                    auVar119._12_4_ = -(uint)(iVar18 < auVar54._12_4_);
                    auVar73._4_4_ = iVar155;
                    auVar73._0_4_ = iVar155;
                    auVar73._8_4_ = iVar159;
                    auVar73._12_4_ = iVar159;
                    auVar101._4_4_ = -(uint)(auVar54._4_4_ == iVar15);
                    auVar101._12_4_ = -(uint)(auVar54._12_4_ == iVar18);
                    auVar101._0_4_ = auVar101._4_4_;
                    auVar101._8_4_ = auVar101._12_4_;
                    auVar119._0_4_ = auVar119._4_4_;
                    auVar119._8_4_ = auVar119._12_4_;
                    auVar54 = auVar101 & auVar73 | auVar119;
                    auVar54 = packssdw(auVar54,auVar54);
                    auVar54 = packssdw(auVar54 ^ auVar128,auVar54 ^ auVar128);
                    auVar54 = packsswb(auVar54,auVar54);
                    if ((auVar54 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      *(char *)(psVar43 + uVar41 * 2 + 0xfffffffffffffff6) = cVar9;
                    }
                    auVar134 = pshufhw(auVar73,auVar73,0x84);
                    auVar59 = pshufhw(auVar101,auVar101,0x84);
                    auVar136 = pshufhw(auVar134,auVar119,0x84);
                    auVar134 = (auVar136 | auVar59 & auVar134) ^ auVar128;
                    auVar134 = packssdw(auVar134,auVar134);
                    auVar134 = packsswb(auVar134,auVar134);
                    if ((auVar134._10_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar43 + uVar41 * 2 + 0xfffffffffffffff8) = cVar9;
                    }
                    auVar134 = (auVar45 | auVar47) ^ _DAT_00246480;
                    iVar155 = -(uint)(iVar11 < auVar134._0_4_);
                    auVar75._4_4_ = -(uint)(iVar15 < auVar134._4_4_);
                    iVar159 = -(uint)(iVar35 < auVar134._8_4_);
                    auVar75._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
                    auVar102._4_4_ = iVar155;
                    auVar102._0_4_ = iVar155;
                    auVar102._8_4_ = iVar159;
                    auVar102._12_4_ = iVar159;
                    auVar54 = pshuflw(auVar54,auVar102,0xe8);
                    auVar74._4_4_ = -(uint)(auVar134._4_4_ == iVar15);
                    auVar74._12_4_ = -(uint)(auVar134._12_4_ == iVar18);
                    auVar74._0_4_ = auVar74._4_4_;
                    auVar74._8_4_ = auVar74._12_4_;
                    auVar136 = pshuflw(auVar128,auVar74,0xe8);
                    auVar75._0_4_ = auVar75._4_4_;
                    auVar75._8_4_ = auVar75._12_4_;
                    auVar134 = pshuflw(auVar54,auVar75,0xe8);
                    in_XMM6._8_4_ = 0xffffffff;
                    in_XMM6._0_8_ = 0xffffffffffffffff;
                    in_XMM6._12_4_ = 0xffffffff;
                    auVar54 = (auVar134 | auVar136 & auVar54) ^ in_XMM6;
                    auVar54 = packssdw(auVar54,auVar54);
                    in_XMM5 = packsswb(auVar54,auVar54);
                    if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar43 + uVar41 * 2 + 0xfffffffffffffffa) = cVar9;
                    }
                    auVar75 = auVar74 & auVar102 | auVar75;
                    auVar54 = packssdw(auVar75,auVar75);
                    auVar54 = packssdw(auVar54 ^ in_XMM6,auVar54 ^ in_XMM6);
                    auVar54 = packsswb(auVar54,auVar54);
                    if ((auVar54._12_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar43 + uVar41 * 2 + 0xfffffffffffffffc) = cVar9;
                    }
                    auVar54 = (auVar45 | auVar125) ^ _DAT_00246480;
                    auVar103._0_4_ = -(uint)(iVar11 < auVar54._0_4_);
                    auVar103._4_4_ = -(uint)(iVar15 < auVar54._4_4_);
                    auVar103._8_4_ = -(uint)(iVar35 < auVar54._8_4_);
                    auVar103._12_4_ = -(uint)(iVar18 < auVar54._12_4_);
                    auVar76._4_4_ = auVar103._0_4_;
                    auVar76._0_4_ = auVar103._0_4_;
                    auVar76._8_4_ = auVar103._8_4_;
                    auVar76._12_4_ = auVar103._8_4_;
                    auVar46._4_4_ = -(uint)(auVar54._4_4_ == iVar15);
                    auVar46._12_4_ = -(uint)(auVar54._12_4_ == iVar18);
                    auVar46._0_4_ = auVar46._4_4_;
                    auVar46._8_4_ = auVar46._12_4_;
                    auVar55._4_4_ = auVar103._4_4_;
                    auVar55._0_4_ = auVar103._4_4_;
                    auVar55._8_4_ = auVar103._12_4_;
                    auVar55._12_4_ = auVar103._12_4_;
                    auVar54 = packssdw(auVar103,auVar46 & auVar76 | auVar55);
                    auVar54 = packssdw(auVar54 ^ in_XMM6,auVar54 ^ in_XMM6);
                    auVar54 = packsswb(auVar54,auVar54);
                    if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar43 + uVar41 * 2 + 0xfffffffffffffffe) = cVar9;
                    }
                    auVar136 = pshufhw(auVar76,auVar76,0x84);
                    auVar54 = pshufhw(auVar46,auVar46,0x84);
                    auVar134 = pshufhw(auVar55,auVar55,0x84);
                    auVar54 = packssdw(auVar54 & auVar136,(auVar134 | auVar54 & auVar136) ^ in_XMM6)
                    ;
                    auVar54 = packsswb(auVar54,auVar54);
                    if ((auVar54._14_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar43 + uVar41 * 2) = cVar9;
                    }
                    uVar41 = uVar41 + 0x10;
                  } while (((ulong)((uVar17 + uVar16) * (uVar32 + uVar42)) + 0xf &
                           0xfffffffffffffff0) != uVar41);
                }
                uVar40 = uVar40 + 1;
                psVar43 = (stbi__uint16 *)((long)psVar43 + 1);
              } while (uVar40 != 4);
            }
            if (3 < uVar12) {
              if (ri->bits_per_channel == 0x10) {
                if (0 < iVar39) {
                  uVar40 = 0;
                  do {
                    uVar3 = data_02[uVar40 * 4 + 3];
                    if ((uVar3 != 0) && (uVar3 != 0xffff)) {
                      fVar116 = 1.0 / ((float)uVar3 / 65535.0);
                      fVar95 = (1.0 - fVar116) * 65535.0;
                      auVar125._0_4_ =
                           (int)(fVar95 + fVar116 * (float)(*(uint *)(data_02 + uVar40 * 4) & 0xffff
                                                           ));
                      auVar125._4_4_ =
                           (int)(fVar95 + fVar116 * (float)(*(uint *)(data_02 + uVar40 * 4) >> 0x10)
                                );
                      auVar125._8_4_ = (int)(fVar95 + fVar116 * 0.0);
                      auVar125._12_4_ = (int)(fVar95 + fVar116 * 0.0);
                      auVar125 = pshuflw(auVar125,auVar125,0xe8);
                      *(int *)(data_02 + uVar40 * 4) = auVar125._0_4_;
                      data_02[uVar40 * 4 + 2] =
                           (stbi__uint16)(int)((float)data_02[uVar40 * 4 + 2] * fVar116 + fVar95);
                    }
                    uVar40 = uVar40 + 1;
                  } while ((uVar17 + uVar16) * (uVar32 + uVar42) != uVar40);
                }
              }
              else if (0 < iVar39) {
                uVar40 = 0;
                do {
                  bVar26 = *(byte *)((long)data_02 + uVar40 * 4 + 3);
                  if ((bVar26 != 0) && (bVar26 != 0xff)) {
                    fVar116 = 1.0 / ((float)bVar26 / 255.0);
                    fVar95 = (1.0 - fVar116) * 255.0;
                    *(char *)(data_02 + uVar40 * 2) =
                         (char)(int)((float)(byte)data_02[uVar40 * 2] * fVar116 + fVar95);
                    *(char *)((long)data_02 + uVar40 * 4 + 1) =
                         (char)(int)((float)*(byte *)((long)data_02 + uVar40 * 4 + 1) * fVar116 +
                                    fVar95);
                    *(char *)(data_02 + uVar40 * 2 + 1) =
                         (char)(int)((float)(byte)data_02[uVar40 * 2 + 1] * fVar116 + fVar95);
                  }
                  uVar40 = uVar40 + 1;
                } while ((uVar17 + uVar16) * (uVar32 + uVar42) != uVar40);
              }
            }
            if ((req_comp & 0xfffffffbU) != 0) {
              if (ri->bits_per_channel == 0x10) {
                data_02 = stbi__convert_format16(data_02,4,req_comp,uVar19,uVar27);
              }
              else {
                data_02 = (stbi__uint16 *)
                          stbi__convert_format((uchar *)data_02,4,req_comp,uVar19,uVar27);
              }
              if (data_02 == (stbi__uint16 *)0x0) {
                return (void *)0x0;
              }
            }
            if (comp != (int *)0x0) {
              *comp = 4;
            }
            *y = uVar27;
            *x = uVar19;
            return data_02;
          }
          goto LAB_001b3feb;
        }
      }
    }
  }
LAB_001b2ab0:
  lVar33 = *in_FS_OFFSET;
  pcVar28 = "too large";
LAB_001b1f1f:
  *(char **)(lVar33 + -0x20) = pcVar28;
  return (void *)0x0;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}